

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putUcs4(QDebug *this,uint ucs4)

{
  long lVar1;
  QTextStreamManipulator m;
  QTextStreamManipulator m_00;
  QTextStreamManipulator m_01;
  QChar ch;
  uint in_ESI;
  long in_FS_OFFSET;
  QTextStreamFunction in_stack_ffffffffffffff18;
  char c;
  QTextStream *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff2c;
  uint i;
  QTextStream *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar2;
  char in_stack_ffffffffffffff3f;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff78;
  QTextStreamFunction local_80;
  QTextStream *pQStack_78;
  undefined8 local_70;
  QTextStream *pQStack_68;
  undefined8 local_60;
  QTextStreamFunction local_58;
  QTextStream *pQStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  QTextStreamFunction local_30;
  QTextStream *pQStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  maybeQuote((QDebug *)in_stack_ffffffffffffff20,(char)((ulong)in_stack_ffffffffffffff18 >> 0x38));
  if (in_ESI < 0x20) {
    QTextStream::operator<<
              ((QTextStream *)
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
               in_stack_ffffffffffffff78);
    ::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    QTextStream::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    ::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    c = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  }
  else if (in_ESI < 0x80) {
    QTextStream::operator<<
              ((QTextStream *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3f);
    c = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  }
  else {
    if (in_ESI < 0x10000) {
      QTextStream::operator<<
                ((QTextStream *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                 in_stack_ffffffffffffff78);
      qSetFieldWidth(in_stack_ffffffffffffff44);
      uVar2 = (undefined1)((ulong)local_10 >> 0x30);
      uVar3 = (undefined1)((ulong)local_10 >> 0x38);
      m._8_4_ = (int)local_20;
      m.mf = (QTSMFI)pQStack_28;
      m._12_4_ = (int)((ulong)local_20 >> 0x20);
      m.mc = uStack_18;
      m._24_6_ = (int6)local_10;
      m._30_1_ = uVar2;
      m._31_1_ = uVar3;
      m.arg = in_stack_ffffffffffffff40;
      m._36_4_ = in_stack_ffffffffffffff44;
      ::operator<<((QTextStream *)0x27775b,m);
    }
    else {
      QTextStream::operator<<
                ((QTextStream *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                 in_stack_ffffffffffffff78);
      qSetFieldWidth(in_stack_ffffffffffffff44);
      uVar2 = (undefined1)((ulong)local_38 >> 0x30);
      uVar3 = (undefined1)((ulong)local_38 >> 0x38);
      m_00._8_4_ = (int)local_48;
      m_00.mf = (QTSMFI)pQStack_50;
      m_00._12_4_ = (int)((ulong)local_48 >> 0x20);
      m_00.mc = uStack_40;
      m_00._24_6_ = (int6)local_38;
      m_00._30_1_ = uVar2;
      m_00._31_1_ = uVar3;
      m_00.arg = in_stack_ffffffffffffff40;
      m_00._36_4_ = in_stack_ffffffffffffff44;
      ::operator<<((QTextStream *)0x2777b8,m_00);
      local_30 = local_58;
      pQStack_28 = pQStack_50;
    }
    ::operator<<(pQStack_28,local_30);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff7e,L'0');
    ch.ucs._1_1_ = uVar3;
    ch.ucs._0_1_ = uVar2;
    qSetPadChar(ch);
    i = (uint)((ulong)local_70 >> 0x20);
    m_01._8_4_ = (int)local_70;
    m_01.mf = (QTSMFI)pQStack_78;
    m_01._12_4_ = i;
    m_01.mc = (QTSMFC)pQStack_68;
    m_01._24_6_ = (int6)local_60;
    m_01._30_1_ = (char)((ulong)local_60 >> 0x30);
    m_01._31_1_ = (char)((ulong)local_60 >> 0x38);
    m_01.arg = in_stack_ffffffffffffff40;
    m_01._36_4_ = in_stack_ffffffffffffff44;
    ::operator<<((QTextStream *)0x277819,m_01);
    QTextStream::operator<<(pQStack_68,i);
    ::operator<<(pQStack_78,local_80);
    c = (char)((ulong)local_80 >> 0x38);
    in_stack_ffffffffffffff20 = pQStack_78;
  }
  maybeQuote((QDebug *)in_stack_ffffffffffffff20,c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putUcs4(uint ucs4)
{
    maybeQuote('\'');
    if (ucs4 < 0x20) {
        stream->ts << "\\x" << Qt::hex << ucs4 << Qt::reset;
    } else if (ucs4 < 0x80) {
        stream->ts << char(ucs4);
    } else {
        if (ucs4 < 0x10000)
            stream->ts << "\\u" << qSetFieldWidth(4);
        else
            stream->ts << "\\U" << qSetFieldWidth(8);
        stream->ts << Qt::hex << qSetPadChar(u'0') << ucs4 << Qt::reset;
    }
    maybeQuote('\'');
}